

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool __thiscall ON_BinaryArchive::SeekFromStart(ON_BinaryArchive *this,ON__UINT64 bytes_from_start)

{
  bool bVar1;
  uint uVar2;
  ON_3DM_BIG_CHUNK *pOVar3;
  ON__UINT64 OVar4;
  bool local_31;
  ON_3DM_BIG_CHUNK *c;
  ON__UINT64 bytes_from_start_local;
  ON_BinaryArchive *this_local;
  
  bVar1 = UnsetMode(this);
  if (bVar1) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
               ,0x2da,"","Invalid archive Mode().");
    this_local._7_1_ = false;
  }
  else if (((this->m_bChunkBoundaryCheck & 1U) == 0) ||
          (pOVar3 = ON_SimpleArray<ON_3DM_BIG_CHUNK>::Last(&this->m_chunk),
          pOVar3 == (ON_3DM_BIG_CHUNK *)0x0)) {
    OVar4 = CurrentPosition(this);
    if (OVar4 != 0) {
      uVar2 = (*this->_vptr_ON_BinaryArchive[4])();
      if ((uVar2 & 1) == 0) {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                   ,0x2ed,"","Internal_SeekToStartOverride() failed.");
        bVar1 = ReadMode(this);
        if (bVar1) {
          SetStorageDeviceError(this,SeekFailedDuringReading);
        }
        bVar1 = WriteMode(this);
        if (bVar1) {
          SetStorageDeviceError(this,SeekFailedDuringWriting);
        }
        return false;
      }
      this->m_current_positionX = 0;
    }
    if (bytes_from_start == 0) {
      local_31 = true;
    }
    else {
      local_31 = SeekForward(this,bytes_from_start);
    }
    this_local._7_1_ = local_31;
  }
  else {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
               ,0x2e3,"","Attempt to seek before beginning of current chunk.");
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_BinaryArchive::SeekFromStart( ON__UINT64 bytes_from_start )
{
  if (UnsetMode())
  {
    ON_ERROR("Invalid archive Mode().");
    return false;
  }

  if (m_bChunkBoundaryCheck)
  {
    const ON_3DM_BIG_CHUNK* c = m_chunk.Last();
    if (nullptr != c)
    {
      ON_ERROR("Attempt to seek before beginning of current chunk.");
      return false;
    }
  } 

  if (0 != CurrentPosition() )
  {
    // Internal_SeekToStart() is a pure virutal function that must overridden.
    if (!Internal_SeekToStartOverride())
    {
      ON_ERROR("Internal_SeekToStartOverride() failed.");
      if (ReadMode())
        SetStorageDeviceError(ON_BinaryArchive::eStorageDeviceError::SeekFailedDuringReading);
      if (WriteMode())
        SetStorageDeviceError(ON_BinaryArchive::eStorageDeviceError::SeekFailedDuringWriting);
      return false;
    }
    m_current_positionX = 0;
  }

  return (bytes_from_start > 0) ? SeekForward(bytes_from_start) : true;
}